

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.hpp
# Opt level: O0

void __thiscall
boost::unordered::detail::
table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
::table(table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
        *this,size_t num_buckets,hasher *hf,key_equal *eq,node_allocator *a)

{
  unsigned_long *puVar1;
  unsigned_long uVar2;
  compressed<std::allocator<boost::unordered::detail::ptr_bucket>,_std::allocator<boost::unordered::detail::ptr_node<std::pair<const_unsigned_int,_double>_>_>_>
  *in_RCX;
  unsigned_long in_RSI;
  long in_RDI;
  allocator<boost::unordered::detail::ptr_node<std::pair<const_unsigned_int,_double>_>_> *in_R8;
  hash<unsigned_int> *in_stack_ffffffffffffffa8;
  functions<boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_> *in_stack_ffffffffffffffb0;
  allocator<boost::unordered::detail::ptr_node<std::pair<const_unsigned_int,_double>_>_>
  *in_stack_ffffffffffffffd0;
  
  functions<boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>::functions
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(equal_to<unsigned_int> *)0x8d8316)
  ;
  compressed<std::allocator<boost::unordered::detail::ptr_bucket>,std::allocator<boost::unordered::detail::ptr_node<std::pair<unsigned_int_const,double>>>>
  ::
  compressed<std::allocator<boost::unordered::detail::ptr_node<std::pair<unsigned_int_const,double>>>,std::allocator<boost::unordered::detail::ptr_node<std::pair<unsigned_int_const,double>>>>
            (in_RCX,in_R8,in_stack_ffffffffffffffd0);
  puVar1 = (unsigned_long *)(in_RDI + 8);
  uVar2 = mix64_policy<unsigned_long>::new_bucket_count(in_RSI);
  *puVar1 = uVar2;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  *(undefined4 *)(in_RDI + 0x18) = 0x3f800000;
  *(undefined8 *)(in_RDI + 0x20) = 0;
  *(undefined8 *)(in_RDI + 0x28) = 0;
  return;
}

Assistant:

table(std::size_t num_buckets,
                hasher const& hf,
                key_equal const& eq,
                node_allocator const& a) :
            functions(hf, eq),
            allocators_(a,a),
            bucket_count_(policy::new_bucket_count(num_buckets)),
            size_(0),
            mlf_(1.0f),
            max_load_(0),
            buckets_()
        {}